

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_check_pubkey(mbedtls_rsa_context *ctx)

{
  int iVar1;
  size_t sVar2;
  int in_EDX;
  int iVar3;
  mbedtls_mpi *X;
  
  iVar1 = rsa_check_context(ctx,0,in_EDX);
  iVar3 = -0x4200;
  if (iVar1 == 0) {
    sVar2 = mbedtls_mpi_bitlen(&ctx->N);
    if (0x7f < sVar2) {
      X = &ctx->E;
      iVar1 = mbedtls_mpi_get_bit(X,0);
      if (iVar1 != 0) {
        sVar2 = mbedtls_mpi_bitlen(X);
        if (1 < sVar2) {
          iVar1 = mbedtls_mpi_cmp_mpi(X,&ctx->N);
          iVar3 = -0x4200;
          if (iVar1 < 0) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_check_pubkey( const mbedtls_rsa_context *ctx )
{
    RSA_VALIDATE_RET( ctx != NULL );

    if( rsa_check_context( ctx, 0 /* public */, 0 /* no blinding */ ) != 0 )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    if( mbedtls_mpi_bitlen( &ctx->N ) < 128 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    if( mbedtls_mpi_get_bit( &ctx->E, 0 ) == 0 ||
        mbedtls_mpi_bitlen( &ctx->E )     < 2  ||
        mbedtls_mpi_cmp_mpi( &ctx->E, &ctx->N ) >= 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    return( 0 );
}